

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaL_addvalue(luaL_Buffer *B)

{
  lua_State *L;
  int iVar1;
  char *__src;
  size_t vl;
  ulong local_20;
  
  L = B->L;
  __src = lua_tolstring(L,-1,&local_20);
  if ((ulong)((long)B + (0x2018 - (long)B->p)) < local_20) {
    iVar1 = emptybuffer(B);
    if (iVar1 != 0) {
      lua_insert(L,-2);
    }
    B->lvl = B->lvl + 1;
    adjuststack(B);
  }
  else {
    memcpy(B->p,__src,local_20);
    B->p = B->p + local_20;
    L->top = L->top + -1;
  }
  return;
}

Assistant:

static void luaL_addvalue(luaL_Buffer*B){
lua_State*L=B->L;
size_t vl;
const char*s=lua_tolstring(L,-1,&vl);
if(vl<=bufffree(B)){
memcpy(B->p,s,vl);
B->p+=vl;
lua_pop(L,1);
}
else{
if(emptybuffer(B))
lua_insert(L,-2);
B->lvl++;
adjuststack(B);
}
}